

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::InterfaceVariableAccessHandler::handle
          (InterfaceVariableAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint uVar1;
  Variant *pVVar2;
  SPIRVariable *pSVar3;
  SPIRExtension *pSVar4;
  ulong uVar5;
  bool bVar6;
  uint32_t i;
  ulong uVar7;
  __node_gen_type __node_gen;
  uint32_t local_3c;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_38;
  
  bVar6 = true;
  if ((int)opcode < 0xa9) {
    switch(opcode) {
    case OpFunctionCall:
      if (2 < length) {
        if (length - 3 == 0) {
          return true;
        }
        uVar7 = 0;
        do {
          uVar5 = (ulong)args[uVar7 + 3];
          if ((uVar5 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size)
             && (pVVar2 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
                pVVar2[uVar5].type == TypeVariable)) {
            pSVar3 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar5);
            if ((pSVar3->storage < (StorageClassStorageBuffer|StorageClassInput)) &&
               ((0x160fU >> (pSVar3->storage & 0x1f) & 1) != 0)) {
              local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)this->variables;
              local_3c = args[uVar7 + 3];
              ::std::
              _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                        (local_38,&local_3c,&local_38);
            }
          }
          uVar7 = uVar7 + 1;
        } while (length - 3 != uVar7);
        return true;
      }
      break;
    case OpFunctionEnd|OpSourceContinued:
    case OpVariable:
    case OpCopyMemorySized:
      goto switchD_002b7aa6_caseD_f3;
    case OpImageTexelPointer:
    case OpLoad:
    case OpAccessChain:
    case OpInBoundsAccessChain:
    case OpPtrAccessChain:
    case OpArrayLength:
switchD_002b7aa6_caseD_e3:
      if (2 < length) {
        args = args + 2;
LAB_002b7b59:
        uVar1 = *args;
        uVar7 = (ulong)uVar1;
        if (uVar7 == 0) {
          return true;
        }
        if ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar7) {
          return true;
        }
        pVVar2 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar2[uVar7].type != TypeVariable) {
          return true;
        }
        pSVar3 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar7);
        if (StorageClassStorageBuffer < pSVar3->storage) {
          return true;
        }
        if ((0x160fU >> (pSVar3->storage & 0x1f) & 1) == 0) {
          return true;
        }
        local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this->variables;
        local_3c = uVar1;
LAB_002b7bb5:
        ::std::
        _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                  ();
        return true;
      }
      break;
    case OpStore:
      goto switchD_002b7aa6_caseD_e4;
    case OpCopyMemory:
      if (1 < length) {
        uVar7 = (ulong)*args;
        if ((uVar7 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
           (pVVar2 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
           pVVar2[uVar7].type == TypeVariable)) {
          pSVar3 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar7);
          if ((pSVar3->storage < (StorageClassStorageBuffer|StorageClassInput)) &&
             ((0x160fU >> (pSVar3->storage & 0x1f) & 1) != 0)) {
            local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)this->variables;
            local_3c = *args;
            ::std::
            _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                      ();
          }
        }
        uVar7 = (ulong)args[1];
        if ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar7) {
          return true;
        }
        pVVar2 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar2[uVar7].type != TypeVariable) {
          return true;
        }
        pSVar3 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar7);
        if (StorageClassStorageBuffer < pSVar3->storage) {
          return true;
        }
        if ((0x160fU >> (pSVar3->storage & 0x1f) & 1) == 0) {
          return true;
        }
        local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this->variables;
        local_3c = args[1];
        goto LAB_002b7bb5;
      }
      break;
    default:
      if (opcode != OpExtInst) {
        if (opcode != OpCopyObject) {
          return true;
        }
        goto switchD_002b7aa6_caseD_e3;
      }
      if (4 < length) {
        pSVar4 = Variant::get<spirv_cross::SPIRExtension>
                           ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                            args[2]);
        if (*(int *)&(pSVar4->super_IVariant).field_0xc != 4) {
          return true;
        }
        if (args[3] != 1) {
          return true;
        }
        uVar7 = (ulong)args[4];
        if ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar7) {
          return true;
        }
        pVVar2 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar2[uVar7].type != TypeVariable) {
          return true;
        }
        pSVar3 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar7);
        if (StorageClassStorageBuffer < pSVar3->storage) {
          return true;
        }
        if ((0x160fU >> (pSVar3->storage & 0x1f) & 1) == 0) {
          return true;
        }
        local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this->variables;
        local_3c = args[4];
        goto LAB_002b7bb5;
      }
    }
  }
  else {
    switch(opcode) {
    case OpAtomicLoad:
    case OpAtomicExchange:
    case OpAtomicCompareExchange:
    case OpAtomicCompareExchangeWeak:
    case OpAtomicIIncrement:
    case OpAtomicIDecrement:
    case OpAtomicIAdd:
    case OpAtomicISub:
    case OpAtomicSMin:
    case OpAtomicUMin:
    case OpAtomicSMax:
    case OpAtomicUMax:
    case OpAtomicAnd:
    case OpAtomicOr:
    case OpAtomicXor:
      goto switchD_002b7aa6_caseD_e3;
    case OpAtomicStore:
switchD_002b7aa6_caseD_e4:
      if (length != 0) goto LAB_002b7b59;
      break;
    case OpAtomicXor|OpUndef:
    case OpAtomicAnd|OpSourceExtension:
      goto switchD_002b7aa6_caseD_f3;
    case OpPhi:
      if (1 < length) {
        if (length - 2 == 0) {
          return true;
        }
        uVar7 = 0;
        do {
          uVar5 = (ulong)args[uVar7 + 2];
          if ((uVar5 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size)
             && (pVVar2 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
                pVVar2[uVar5].type == TypeVariable)) {
            pSVar3 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar5);
            if ((pSVar3->storage < (StorageClassStorageBuffer|StorageClassInput)) &&
               ((0x160fU >> (pSVar3->storage & 0x1f) & 1) != 0)) {
              local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)this->variables;
              local_3c = args[uVar7 + 2];
              ::std::
              _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                        (local_38,&local_3c,&local_38);
            }
          }
          uVar7 = uVar7 + 2;
        } while (uVar7 < length - 2);
        return true;
      }
      break;
    default:
      if (opcode != OpSelect) {
        return true;
      }
      if (4 < length) {
        uVar7 = 0;
        do {
          uVar5 = (ulong)args[uVar7 + 3];
          if ((uVar5 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size)
             && (pVVar2 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
                pVVar2[uVar5].type == TypeVariable)) {
            pSVar3 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar5);
            if ((pSVar3->storage < (StorageClassStorageBuffer|StorageClassInput)) &&
               ((0x160fU >> (pSVar3->storage & 0x1f) & 1) != 0)) {
              local_38 = (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)this->variables;
              local_3c = args[uVar7 + 3];
              ::std::
              _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<spirv_cross::TypedID<(spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spirv_cross::TypedID<(spirv_cross::Types)2>,true>>>>
                        (local_38,&local_3c,&local_38);
            }
          }
          uVar7 = uVar7 + 1;
        } while (length - 3 != uVar7);
        return true;
      }
    }
  }
  bVar6 = false;
switchD_002b7aa6_caseD_f3:
  return bVar6;
}

Assistant:

bool Compiler::InterfaceVariableAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	uint32_t variable = 0;
	switch (opcode)
	{
	// Need this first, otherwise, GCC complains about unhandled switch statements.
	default:
		break;

	case OpFunctionCall:
	{
		// Invalid SPIR-V.
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpSelect:
	{
		// Invalid SPIR-V.
		if (length < 5)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpPhi:
	{
		// Invalid SPIR-V.
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpAtomicStore:
	case OpStore:
		// Invalid SPIR-V.
		if (length < 1)
			return false;
		variable = args[0];
		break;

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		auto *var = compiler.maybe_get<SPIRVariable>(args[0]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[0]);

		var = compiler.maybe_get<SPIRVariable>(args[1]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[1]);
		break;
	}

	case OpExtInst:
	{
		if (length < 5)
			return false;
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::SPV_AMD_shader_explicit_vertex_parameter)
		{
			enum AMDShaderExplicitVertexParameter
			{
				InterpolateAtVertexAMD = 1
			};

			auto op = static_cast<AMDShaderExplicitVertexParameter>(args[3]);

			switch (op)
			{
			case InterpolateAtVertexAMD:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			default:
				break;
			}
		}
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpLoad:
	case OpCopyObject:
	case OpImageTexelPointer:
	case OpAtomicLoad:
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpArrayLength:
		// Invalid SPIR-V.
		if (length < 3)
			return false;
		variable = args[2];
		break;
	}

	if (variable)
	{
		auto *var = compiler.maybe_get<SPIRVariable>(variable);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(variable);
	}
	return true;
}